

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O2

void xLearn::write_data(string *filename,string *data)

{
  FILE *__s;
  size_t sVar1;
  int iVar2;
  char *message;
  bool bVar3;
  uint32 write_len;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  __s = (FILE *)OpenFileOrDie((filename->_M_dataplus)._M_p,"w");
  iVar2 = 100000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    sVar1 = fwrite((data->_M_dataplus)._M_p,1,data->_M_string_length,__s);
    write_len = (uint32)sVar1;
    local_50.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         data->_M_string_length;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar,"write_len","data.size()",&write_len,(unsigned_long *)&local_50
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/reader_test.cc"
                 ,0x3b,message);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  Close((FILE *)__s);
  return;
}

Assistant:

void write_data(const std::string& filename,
                const std::string& data) {
  FILE* file = OpenFileOrDie(filename.c_str(), "w");
  for (index_t i = 0; i < kNumLines; ++i) {
    uint32 write_len = fwrite(data.c_str(), 1, data.size(), file);
    EXPECT_EQ(write_len, data.size());
  }
  Close(file);
}